

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_d00101::MultiADescriptor::MakeScripts
          (MultiADescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_3,FlatSigningProvider *param_4)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  bool bVar2;
  CScript *this_00;
  size_type sVar3;
  __extent_storage<18446744073709551615UL> in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  CPubKey *key;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> xkeys;
  CScript ret;
  CScript *in_stack_fffffffffffffea8;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_fffffffffffffeb0;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffeb8;
  __normal_iterator<XOnlyPubKey_*,_std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>_>
  in_stack_fffffffffffffec0;
  ulong uVar4;
  __normal_iterator<XOnlyPubKey_*,_std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>_>
  in_stack_fffffffffffffec8;
  opcodetype opcode;
  CScript *this_01;
  ulong local_108;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  CScript::CScript(in_stack_fffffffffffffea8);
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::vector
            ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffea8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::size
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffea8);
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::reserve
            ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_RSI._M_extent_value,
             (size_type)this_01);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin(in_stack_fffffffffffffeb0);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::end(in_stack_fffffffffffffeb0);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                      ((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_fffffffffffffeb8,
                       (__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_fffffffffffffeb0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator*((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *
              )in_stack_fffffffffffffea8);
    std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>::emplace_back<CPubKey_const&>
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)
               in_stack_fffffffffffffec8._M_current,(CPubKey *)in_stack_fffffffffffffec0._M_current)
    ;
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator++((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                *)in_stack_fffffffffffffea8);
  }
  if ((*(byte *)((long)(in_RSI._M_extent_value + 0x40) + 0x1c) & 1) != 0) {
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::begin
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffeb0);
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::end
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffeb0);
    std::
    sort<__gnu_cxx::__normal_iterator<XOnlyPubKey*,std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>>>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::operator[]
            ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffeb8,
             (size_type)in_stack_fffffffffffffeb0);
  ToByteVector<XOnlyPubKey>((XOnlyPubKey *)in_RSI._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffeb8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
  b._M_extent._M_extent_value = in_RSI._M_extent_value;
  b._M_ptr = (pointer)this_01;
  this_00 = CScript::operator<<((CScript *)in_stack_fffffffffffffec8._M_current,b);
  CScript::operator<<(this_01,(opcodetype)((ulong)in_RDI >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb8);
  local_108 = 1;
  while( true ) {
    uVar4 = local_108;
    sVar3 = std::vector<CPubKey,_std::allocator<CPubKey>_>::size
                      ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffea8);
    opcode = (opcodetype)((ulong)in_RDI >> 0x20);
    if (sVar3 <= uVar4) break;
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::operator[]
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffeb8,
               (size_type)in_stack_fffffffffffffeb0);
    ToByteVector<XOnlyPubKey>((XOnlyPubKey *)in_RSI._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (in_stack_fffffffffffffeb8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
    b_00._M_extent._M_extent_value = in_RSI._M_extent_value;
    b_00._M_ptr = (pointer)this_01;
    in_stack_fffffffffffffeb8 =
         (span<const_unsigned_char,_18446744073709551615UL> *)CScript::operator<<(this_00,b_00);
    CScript::operator<<(this_01,(opcodetype)((ulong)in_RDI >> 0x20));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb8);
    local_108 = local_108 + 1;
  }
  CScript::operator<<((CScript *)in_stack_fffffffffffffeb8,(int64_t)in_stack_fffffffffffffeb0);
  CScript::operator<<(this_01,opcode);
  Vector<CScript>((CScript *)in_RSI._M_extent_value);
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::~vector
            ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffeb8);
  CScript::~CScript(in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<CScript,_std::allocator<CScript>_> *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        CScript ret;
        std::vector<XOnlyPubKey> xkeys;
        xkeys.reserve(keys.size());
        for (const auto& key : keys) xkeys.emplace_back(key);
        if (m_sorted) std::sort(xkeys.begin(), xkeys.end());
        ret << ToByteVector(xkeys[0]) << OP_CHECKSIG;
        for (size_t i = 1; i < keys.size(); ++i) {
            ret << ToByteVector(xkeys[i]) << OP_CHECKSIGADD;
        }
        ret << m_threshold << OP_NUMEQUAL;
        return Vector(std::move(ret));
    }